

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMDocumentImpl::removeNodeIterator
          (DOMDocumentImpl *this,DOMNodeIteratorImpl *nodeIterator)

{
  XMLSize_t XVar1;
  DOMNodeIteratorImpl *pDVar2;
  XMLSize_t local_28;
  XMLSize_t i;
  XMLSize_t sz;
  DOMNodeIteratorImpl *nodeIterator_local;
  DOMDocumentImpl *this_local;
  
  if ((this->fNodeIterators != (NodeIterators *)0x0) &&
     (XVar1 = BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>::size
                        (&this->fNodeIterators->
                          super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>), XVar1 != 0)) {
    for (local_28 = 0; local_28 < XVar1; local_28 = local_28 + 1) {
      pDVar2 = BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>::elementAt
                         (&this->fNodeIterators->
                           super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>,local_28);
      if (pDVar2 == nodeIterator) {
        (*(this->fNodeIterators->super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>).
          _vptr_BaseRefVectorOf[4])(this->fNodeIterators,local_28);
        return;
      }
    }
  }
  return;
}

Assistant:

void DOMDocumentImpl::removeNodeIterator(DOMNodeIteratorImpl* nodeIterator)
{
    if (fNodeIterators != 0) {
        XMLSize_t sz = fNodeIterators->size();
        if (sz !=0) {
            for (XMLSize_t i =0; i<sz; i++) {
                if (fNodeIterators->elementAt(i) == nodeIterator) {
                    fNodeIterators->removeElementAt(i);
                    break;
                }
            }
        }
    }
}